

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O2

int __thiscall
anon_unknown.dwarf_3d9::NinjaMain::ToolClean(NinjaMain *this,Options *options,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool generator;
  int iVar3;
  int iVar4;
  char **___argv;
  Cleaner cleaner;
  
  ___argv = argv + -1;
  _optind = 1;
  generator = false;
  bVar2 = false;
  while( true ) {
    do {
      bVar1 = bVar2;
      iVar3 = getopt(argc + 1,___argv,"hgr");
      iVar4 = _optind;
      bVar2 = true;
    } while (iVar3 == 0x72);
    if (iVar3 == -1) break;
    if (iVar3 != 0x67) {
      puts(
          "usage: ninja -t clean [options] [targets]\n\noptions:\n  -g     also clean files marked as ninja generator output\n  -r     interpret targets as a list of rules to clean instead"
          );
      return 1;
    }
    generator = true;
    bVar2 = bVar1;
  }
  iVar3 = (argc + 1) - _optind;
  if ((bool)(iVar3 == 0 & bVar1)) {
    Error("expected a rule to clean");
    return 1;
  }
  Cleaner::Cleaner(&cleaner,&this->state_,this->config_,&(this->disk_interface_).super_DiskInterface
                  );
  if (iVar3 < 1) {
    iVar4 = Cleaner::CleanAll(&cleaner,generator);
  }
  else if (bVar1) {
    iVar4 = Cleaner::CleanRules(&cleaner,iVar3,___argv + iVar4);
  }
  else {
    iVar4 = Cleaner::CleanTargets(&cleaner,iVar3,___argv + iVar4);
  }
  Cleaner::~Cleaner(&cleaner);
  return iVar4;
}

Assistant:

int NinjaMain::ToolClean(const Options* options, int argc, char* argv[]) {
  // The clean tool uses getopt, and expects argv[0] to contain the name of
  // the tool, i.e. "clean".
  argc++;
  argv--;

  bool generator = false;
  bool clean_rules = false;

  optind = 1;
  int opt;
  while ((opt = getopt(argc, argv, const_cast<char*>("hgr"))) != -1) {
    switch (opt) {
    case 'g':
      generator = true;
      break;
    case 'r':
      clean_rules = true;
      break;
    case 'h':
    default:
      printf("usage: ninja -t clean [options] [targets]\n"
"\n"
"options:\n"
"  -g     also clean files marked as ninja generator output\n"
"  -r     interpret targets as a list of rules to clean instead\n"
             );
    return 1;
    }
  }
  argv += optind;
  argc -= optind;

  if (clean_rules && argc == 0) {
    Error("expected a rule to clean");
    return 1;
  }

  Cleaner cleaner(&state_, config_, &disk_interface_);
  if (argc >= 1) {
    if (clean_rules)
      return cleaner.CleanRules(argc, argv);
    else
      return cleaner.CleanTargets(argc, argv);
  } else {
    return cleaner.CleanAll(generator);
  }
}